

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task19.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_44;
  int local_40;
  int i_1;
  int num;
  int i;
  int all_nums [10];
  int n;
  
  all_nums[9] = 0;
  memset(&num,0,0x28);
  std::istream::operator>>((istream *)&std::cin,all_nums + 8);
  for (i_1 = 0; i_1 < all_nums[8]; i_1 = i_1 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_40);
    (&num)[local_40] = (&num)[local_40] + 1;
  }
  for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
    if ((&num)[local_44] != 0) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_44);
      poVar1 = std::operator<<(poVar1,':');
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(&num)[local_44]);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  return 0;
}

Assistant:

int main(){
    int n;
    int all_nums[10] = {};
    cin >> n;
    for (int i =0; i <n; i++){
        int num;
        cin >> num;
        all_nums[num] ++;
    }
    for (int i = 0; i < 10; i++) if (all_nums[i]) cout << i << ':' << all_nums[i] << endl;
    return 0;
}